

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIASound.cpp
# Opt level: O2

void __thiscall
Atari2600::TIASound::apply_samples<(Outputs::Speaker::Action)2>
          (TIASound *this,size_t number_of_samples,MonoSample *target)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint c;
  ulong uVar5;
  int iVar6;
  long lVar7;
  
  uVar5 = 0;
  do {
    if (number_of_samples <= uVar5) {
      return;
    }
    for (lVar7 = 0xc; lVar7 != 0xe; lVar7 = lVar7 + 1) {
      iVar3 = *(int *)(this->volume_ + lVar7 * 4 + -8) + 1;
      *(int *)(this->volume_ + lVar7 * 4 + -8) = iVar3;
      uVar2 = (long)iVar3 / 0x13;
      iVar3 = (int)uVar2;
      switch(this->volume_[lVar7 + -8]) {
      case '\x01':
        if (iVar3 == this->volume_[lVar7 + -10] + 1) {
          iVar3 = *(int *)(this->volume_ + lVar7 * 4 + -0x28);
          *(undefined4 *)(this->volume_ + lVar7 * 4 + -8) = 0;
LAB_002cffbc:
          *(uint *)(this->volume_ + lVar7 * 4 + -0x28) = (iVar3 << 2 ^ iVar3 * 8) & 8U | iVar3 >> 1;
        }
        break;
      case '\x02':
        if ((int)((long)((ulong)(uint)(iVar3 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) %
                 (long)(int)((uint)this->volume_[lVar7 + -10] * 0x1e + 0x1e)) == 0x12) {
          iVar3 = *(int *)(this->volume_ + lVar7 * 4 + -0x28);
          goto LAB_002cffbc;
        }
        break;
      case '\x03':
        if (iVar3 != this->volume_[lVar7 + -10] + 1) break;
        uVar4 = *(uint *)(this->volume_ + lVar7 * 4 + -0x20);
        if ((uVar4 & 1) != 0) {
          uVar1 = *(uint *)(this->volume_ + lVar7 * 4 + -0x28);
          *(uint *)(this->volume_ + lVar7 * 4 + -0x10) = uVar1 & 1;
          *(uint *)(this->volume_ + lVar7 * 4 + -0x28) =
               (uVar1 << 2 ^ uVar1 * 8) & 8 | (int)uVar1 >> 1;
        }
        goto LAB_002cfff2;
      case '\a':
      case '\t':
        iVar6 = this->volume_[lVar7 + -10] + 1;
        goto LAB_002cffe4;
      case '\b':
        if (iVar3 == this->volume_[lVar7 + -10] + 1) {
          iVar3 = *(int *)(this->volume_ + lVar7 * 4 + -0x18);
          *(undefined4 *)(this->volume_ + lVar7 * 4 + -8) = 0;
          *(uint *)(this->volume_ + lVar7 * 4 + -0x18) =
               (iVar3 << 8 ^ iVar3 << 4) & 0x100U | iVar3 >> 1;
        }
        break;
      case '\x0f':
        iVar6 = (uint)this->volume_[lVar7 + -10] + (uint)this->volume_[lVar7 + -10] * 2 + 3;
LAB_002cffe4:
        if (iVar3 == iVar6) {
          uVar4 = *(uint *)(this->volume_ + lVar7 * 4 + -0x20);
          *(undefined4 *)(this->volume_ + lVar7 * 4 + -8) = 0;
LAB_002cfff2:
          *(uint *)(this->volume_ + lVar7 * 4 + -0x20) =
               (uVar4 << 2 ^ uVar4 << 4) & 0x10 | (int)uVar4 >> 1;
        }
      }
    }
    uVar5 = (ulong)((int)uVar5 + 1);
  } while( true );
}

Assistant:

void Atari2600::TIASound::apply_samples(std::size_t number_of_samples, Outputs::Speaker::MonoSample *target) {
	for(unsigned int c = 0; c < number_of_samples; c++) {
		Outputs::Speaker::MonoSample output = 0;
		for(int channel = 0; channel < 2; channel++) {
			divider_counter_[channel] ++;
			int divider_value = divider_counter_[channel] / (38 / CPUTicksPerAudioTick);
			int level = 0;
			switch(control_[channel]) {
				case 0x0: case 0xb:	// constant 1
					level = 1;
				break;

				case 0x4: case 0x5:	// div2 tone
					level = (divider_value / (divider_[channel]+1))&1;
				break;

				case 0xc: case 0xd:	// div6 tone
					level = (divider_value / ((divider_[channel]+1)*3))&1;
				break;

				case 0x6: case 0xa:	// div31 tone
					level = (divider_value / (divider_[channel]+1))%30 <= 18;
				break;

				case 0xe:			// div93 tone
					level = (divider_value / ((divider_[channel]+1)*3))%30 <= 18;
				break;

				case 0x1:			// 4-bit poly
					level = poly4_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly4(channel);
					}
				break;

				case 0x2:			// 4-bit poly div31
					level = poly4_counter_[channel]&1;
					if(divider_value%(30*(divider_[channel]+1)) == 18) {
						advance_poly4(channel);
					}
				break;

				case 0x3:			// 5/4-bit poly
					level = output_state_[channel];
					if(divider_value == divider_[channel]+1) {
						if(poly5_counter_[channel]&1) {
							output_state_[channel] = poly4_counter_[channel]&1;
							advance_poly4(channel);
						}
						advance_poly5(channel);
					}
				break;

				case 0x7: case 0x9:	// 5-bit poly
					level = poly5_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly5(channel);
					}
				break;

				case 0xf:			// 5-bit poly div6
					level = poly5_counter_[channel]&1;
					if(divider_value == (divider_[channel]+1)*3) {
						divider_counter_[channel] = 0;
						advance_poly5(channel);
					}
				break;

				case 0x8:			// 9-bit poly
					level = poly9_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly9(channel);
					}
				break;
			}

			output += (volume_[channel] * per_channel_volume_ * level) >> 4;
		}
		Outputs::Speaker::apply<action>(target[c], output);
	}
}